

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O3

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::push_back
          (circular_q<spdlog::details::log_msg_buffer> *this,log_msg_buffer *item)

{
  size_type sVar1;
  pointer plVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  log_msg_buffer *plVar7;
  pointer plVar8;
  
  if (this->max_items_ != 0) {
    sVar1 = this->tail_;
    plVar2 = (this->v_).
             super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar7 = item;
    plVar8 = plVar2 + sVar1;
    for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
      (plVar8->super_log_msg).logger_name.data_ = (plVar7->super_log_msg).logger_name.data_;
      plVar7 = (log_msg_buffer *)&(plVar7->super_log_msg).logger_name.size_;
      plVar8 = (pointer)&(plVar8->super_log_msg).logger_name.size_;
    }
    plVar2 = plVar2 + sVar1;
    ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
              (&plVar2->buffer,&item->buffer);
    pcVar3 = (plVar2->buffer).super_buffer<char>.ptr_;
    (plVar2->super_log_msg).logger_name.data_ = pcVar3;
    (plVar2->super_log_msg).payload.data_ = pcVar3 + (plVar2->super_log_msg).logger_name.size_;
    uVar6 = (this->tail_ + 1) % this->max_items_;
    this->tail_ = uVar6;
    if (uVar6 == this->head_) {
      uVar4 = 0;
      if (uVar6 + 1 != this->max_items_) {
        uVar4 = uVar6 + 1;
      }
      this->head_ = uVar4;
      this->overrun_counter_ = this->overrun_counter_ + 1;
    }
  }
  return;
}

Assistant:

void push_back(T &&item)
    {
        if (max_items_ > 0)
        {
            v_[tail_] = std::move(item);
            tail_ = (tail_ + 1) % max_items_;

            if (tail_ == head_) // overrun last item if full
            {
                head_ = (head_ + 1) % max_items_;
                ++overrun_counter_;
            }
        }
    }